

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

string * FormatISO8601DateTime_abi_cxx11_(string *__return_storage_ptr__,int64_t nTime)

{
  year_month_day yVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  long *in_stack_ffffffffffffffa8;
  ulong local_50;
  ulong local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  days local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (nTime / 0x15180) * 0x15180;
  lVar2 = nTime / 0x15180 - (ulong)(lVar2 - nTime != 0 && nTime <= lVar2);
  local_30.__r = lVar2;
  yVar1 = std::chrono::year_month_day::_S_from_days(&local_30);
  local_34 = (int)yVar1._M_y._M_y._M_y;
  local_3c = (uint)yVar1 >> 0x18;
  uVar3 = lVar2 * -0x15180 + nTime;
  uVar4 = -uVar3;
  if (0 < (long)uVar3) {
    uVar4 = uVar3;
  }
  local_30.__r = uVar4 / 0xe10;
  local_48 = (uVar4 % 0xe10) / 0x3c;
  local_50 = (uVar4 % 0xe10) % 0x3c;
  local_38 = (uint)yVar1 >> 0x10 & 0xff;
  tinyformat::format<int,unsigned_int,unsigned_int,long,long,long>
            (__return_storage_ptr__,(tinyformat *)"%04i-%02u-%02uT%02i:%02i:%02iZ",(char *)&local_34
             ,(int *)&local_38,&local_3c,(uint *)&local_30,(long *)&local_48,(long *)&local_50,
             in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatISO8601DateTime(int64_t nTime)
{
    const std::chrono::sys_seconds secs{std::chrono::seconds{nTime}};
    const auto days{std::chrono::floor<std::chrono::days>(secs)};
    const std::chrono::year_month_day ymd{days};
    const std::chrono::hh_mm_ss hms{secs - days};
    return strprintf("%04i-%02u-%02uT%02i:%02i:%02iZ", signed{ymd.year()}, unsigned{ymd.month()}, unsigned{ymd.day()}, hms.hours().count(), hms.minutes().count(), hms.seconds().count());
}